

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall
BackwardPass::InstrPreservesNumberValues(BackwardPass *this,Instr *instr,Sym *defSym)

{
  Opnd *this_00;
  _func_int **pp_Var1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  BackwardPass *this_01;
  
  if (instr->m_opcode == Ld_A) {
    OVar3 = IR::Opnd::GetKind(instr->m_src1);
    if (OVar3 == OpndKindReg) {
      this_00 = instr->m_src1;
      OVar3 = IR::Opnd::GetKind(this_00);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      pp_Var1 = this_00[1]._vptr_Opnd;
      pIVar7 = (Instr *)pp_Var1[5];
      if (pIVar7 == (Instr *)0x0) {
        pIVar7 = instr;
      }
      if (((ulong)pp_Var1[3] & 1) != 0) {
        instr = pIVar7;
      }
    }
  }
  this_01 = (BackwardPass *)(ulong)instr->m_opcode;
  bVar4 = OpCodeAttr::ProducesNumber(instr->m_opcode);
  bVar5 = true;
  if (!bVar4) {
    if (instr->m_opcode == Add_A) {
      bVar4 = SymIsIntconstOrSelf(this_01,defSym,instr->m_src1);
      if (bVar4) {
        bVar4 = SymIsIntconstOrSelf(this_01,defSym,instr->m_src2);
        return bVar4;
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool
BackwardPass::InstrPreservesNumberValues(IR::Instr *instr, Sym *defSym)
{
    if (instr->m_opcode == Js::OpCode::Ld_A)
    {
        if (instr->GetSrc1()->IsRegOpnd())
        {
            IR::RegOpnd *src1 = instr->GetSrc1()->AsRegOpnd();
            if (src1->m_sym->IsSingleDef())
            {
                instr = src1->m_sym->GetInstrDef();
            }
        }
    }
    return (OpCodeAttr::ProducesNumber(instr->m_opcode) ||
        (instr->m_opcode == Js::OpCode::Add_A && this->SymIsIntconstOrSelf(defSym, instr->GetSrc1()) && this->SymIsIntconstOrSelf(defSym, instr->GetSrc2())));
}